

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O0

int __thiscall cali::OutputStream::OutputStreamImpl::init(OutputStreamImpl *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  OutputStreamImpl *extraout_RAX;
  openmode __mode;
  Log local_230;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> g;
  OutputStreamImpl *this_local;
  
  if ((this->is_initialized & 1U) == 0) {
    g._M_device = (mutex_type *)this;
    std::lock_guard<std::mutex>::lock_guard(&local_18,&this->init_mutex);
    this->is_initialized = true;
    if (this->type == File) {
      anon_unknown.dwarf_1c551::check_and_create_directory(&this->filename);
      __mode = _S_trunc;
      if (this->mode == Append) {
        __mode = _S_app;
      }
      std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                (&this->fs,&this->filename,__mode);
      bVar1 = std::ofstream::is_open();
      if ((bVar1 & 1) == 0) {
        this->type = None;
        Log::Log(&local_230,0);
        poVar2 = Log::stream(&local_230);
        poVar2 = std::operator<<(poVar2,"Could not open output stream ");
        this_00 = std::filesystem::__cxx11::operator<<(poVar2,&this->filename);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        Log::~Log(&local_230);
      }
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_18);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init()
    {
        if (is_initialized)
            return;

        std::lock_guard<std::mutex> g(init_mutex);

        is_initialized = true;

        if (type == StreamType::File) {
            check_and_create_directory(filename);
            fs.open(filename, mode == Mode::Append ? std::ios::app : std::ios::trunc);

            if (!fs.is_open()) {
                type = StreamType::None;

                Log(0).stream() << "Could not open output stream " << filename << std::endl;
            }
        }
    }